

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureMipmapTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles2::Functional::TextureCubeMipmapCase::iterate(TextureCubeMipmapCase *this)

{
  TextureFormat *pTVar1;
  deUint32 *this_00;
  TextureFormat TVar2;
  CoordType CVar3;
  int iVar4;
  int iVar5;
  RenderContext *context;
  TextureCube *pTVar6;
  ConstPixelBufferAccess *pCVar7;
  TestLog *pTVar8;
  ConstPixelBufferAccess *pCVar9;
  int i;
  int iVar10;
  deUint32 dVar11;
  int iVar12;
  int iVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar14;
  ulong uVar15;
  long lVar16;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  NotSupportedError *this_01;
  Surface *pSVar17;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  char *description;
  uint uVar18;
  void *pvVar19;
  ulong uVar20;
  int local_4b0;
  RandomViewport viewport;
  vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> gridLayout;
  Vector<int,_4> res;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_458 [2];
  undefined1 local_438 [40];
  Surface renderedFrame;
  undefined1 local_3f8 [48];
  vector<float,_std::allocator<float>_> texCoord;
  LodPrecision lodPrec;
  Surface referenceFrame;
  undefined1 local_380 [40];
  Surface errorMask;
  LookupPrecision local_338;
  Random rnd;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_2f8;
  float fStack_2e8;
  undefined1 auStack_2e4 [24];
  float afStack_2cc [15];
  ios_base local_290 [264];
  Vector<int,_4> res_1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  _Alloc_hider local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158 [6];
  ReferenceParams params_1;
  PixelBufferAccess local_58;
  
  iVar12 = (this->m_texture->m_refTexture).m_size * 2;
  iVar10 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar16 = CONCAT44(extraout_var,iVar10);
  iVar10 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  dVar11 = deStringHash((this->super_TestCase).super_TestNode.m_name._M_dataplus._M_p);
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&viewport,(RenderTarget *)CONCAT44(extraout_var_00,iVar10),iVar12,iVar12,dVar11);
  CVar3 = this->m_coordType;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  tcu::Surface::Surface(&renderedFrame,viewport.width,viewport.height);
  if ((iVar12 >> 1 <= viewport.width) && (iVar12 >> 1 <= viewport.height)) {
    glu::TextureCube::upload(this->m_texture);
    (**(code **)(lVar16 + 0xb8))(0x8513,this->m_texture->m_glTexture);
    (**(code **)(lVar16 + 0x1360))(0x8513,0x2802,this->m_wrapS);
    (**(code **)(lVar16 + 0x1360))(0x8513,0x2803,this->m_wrapT);
    (**(code **)(lVar16 + 0x1360))(0x8513,0x2801,this->m_minFilter);
    (**(code **)(lVar16 + 0x1360))(0x8513,0x2800,0x2600);
    dVar11 = (**(code **)(lVar16 + 0x800))();
    glu::checkError(dVar11,"After texture setup",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureMipmapTests.cpp"
                    ,0x265);
    iVar10 = viewport.height;
    iVar12 = viewport.width;
    gridLayout.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    gridLayout.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    gridLayout.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    deRandom_init(&rnd.m_rnd,7);
    randomPartition(&gridLayout,&rnd,0,0,iVar12,iVar10);
    if (iterate()::s_projections == '\0') {
      iterate();
    }
    if (0 < (int)((ulong)((long)gridLayout.
                                super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)gridLayout.
                               super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 4)) {
      uVar20 = 0;
      do {
        iVar12 = gridLayout.
                 super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar20].m_data[0];
        iVar10 = gridLayout.
                 super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar20].m_data[1];
        iVar4 = gridLayout.
                super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar20].m_data[2];
        iVar5 = gridLayout.
                super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar20].m_data[3];
        rnd.m_rnd.x = 1;
        rnd.m_rnd.y = 0;
        rnd.m_rnd._8_8_ = rnd.m_rnd._8_8_ & 0xffffffff00000000;
        lVar14 = 3;
        do {
          (&rnd.m_rnd.x)[lVar14] = 0x3f800000;
          lVar14 = lVar14 + 1;
        } while (lVar14 != 7);
        aStack_2f8._12_4_ = 0.0;
        fStack_2e8 = 0.0;
        lVar14 = 9;
        do {
          (&rnd.m_rnd.x)[lVar14] = 0x3f800000;
          lVar14 = lVar14 + 1;
        } while (lVar14 != 0xd);
        auStack_2e4._16_4_ = 0.0;
        auStack_2e4._20_4_ = 0.0;
        afStack_2cc[0] = 0.0;
        afStack_2cc[1] = 0.0;
        uVar18 = (uint)uVar20;
        glu::TextureTestUtil::computeQuadTexCoordCube
                  (&texCoord,uVar18 + (int)((uVar20 & 0xffffffff) / 6) * -6);
        if (CVar3 == COORDTYPE_PROJECTED) {
          uVar15 = (ulong)((uVar18 & 3) << 4);
          aStack_2f8._M_allocated_capacity =
               *(undefined8 *)((long)iterate::s_projections[0].m_data + uVar15 + 4);
          aStack_2f8._8_4_ = *(float *)((long)iterate::s_projections[0].m_data + uVar15 + 0xc);
          rnd.m_rnd._8_8_ =
               CONCAT44(*(undefined4 *)((long)iterate::s_projections[0].m_data + uVar15),rnd.m_rnd.z
                       ) | 1;
        }
        if (CVar3 == COORDTYPE_BASIC_BIAS) {
          rnd.m_rnd._8_8_ = rnd.m_rnd._8_8_ | 2;
          aStack_2f8._12_4_ = Accuracy::Texture2DMipmapCase::iterate::s_bias[uVar18 & 7];
        }
        (**(code **)(lVar16 + 0x1a00))(iVar12 + viewport.x,iVar10 + viewport.y,iVar4,iVar5);
        deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
                  (&this->m_renderer,0,
                   texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start,(RenderParams *)&rnd);
        uVar20 = uVar20 + 1;
      } while ((long)uVar20 <
               (long)(int)((ulong)((long)gridLayout.
                                         super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)gridLayout.
                                        super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 4));
    }
    dVar11 = (**(code **)(lVar16 + 0x800))();
    glu::checkError(dVar11,"Draw",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureMipmapTests.cpp"
                    ,0x294);
    context = this->m_renderCtx;
    params_1.super_RenderParams.texType = TEXTURETYPE_LAST;
    params_1.super_RenderParams.samplerType = SAMPLERTYPE_SHADOW;
    pvVar19 = (void *)renderedFrame.m_pixels.m_cap;
    if (renderedFrame.m_pixels.m_cap != 0) {
      pvVar19 = renderedFrame.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)&rnd,(TextureFormat *)&params_1,renderedFrame.m_width,
               renderedFrame.m_height,1,pvVar19);
    glu::readPixels(context,viewport.x,viewport.y,(PixelBufferAccess *)&rnd);
    dVar11 = (**(code **)(lVar16 + 0x800))();
    glu::checkError(dVar11,"Read pixels",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureMipmapTests.cpp"
                    ,0x298);
    tcu::Surface::Surface(&referenceFrame,viewport.width,viewport.height);
    tcu::Surface::Surface(&errorMask,viewport.width,viewport.height);
    glu::TextureTestUtil::ReferenceParams::ReferenceParams(&params_1,TEXTURETYPE_CUBE);
    lVar16 = 0;
    do {
      local_338.coordBits.m_data[lVar16] = 0x16;
      lVar16 = lVar16 + 1;
    } while (lVar16 != 3);
    lVar16 = 3;
    do {
      local_338.coordBits.m_data[lVar16] = 0x10;
      lVar16 = lVar16 + 1;
    } while (lVar16 != 6);
    local_338.colorThreshold.m_data[0] = 0.0;
    local_338.colorThreshold.m_data[1] = 0.0;
    local_338.colorThreshold.m_data[2] = 0.0;
    local_338.colorThreshold.m_data[3] = 0.0;
    local_338.colorMask.m_data[0] = true;
    local_338.colorMask.m_data[1] = true;
    local_338.colorMask.m_data[2] = true;
    local_338.colorMask.m_data[3] = true;
    lodPrec.rule = RULE_OPENGL;
    lodPrec.derivateBits = 0x16;
    lodPrec.lodBits = 0x10;
    glu::mapGLSampler((Sampler *)&rnd,this->m_wrapS,this->m_wrapT,this->m_minFilter,0x2600);
    params_1.sampler.magFilter = aStack_2f8._M_allocated_capacity._0_4_;
    params_1.sampler.lodThreshold = (float)aStack_2f8._M_allocated_capacity._4_4_;
    params_1.sampler._24_4_ = aStack_2f8._8_4_;
    params_1.sampler.compare = aStack_2f8._12_4_;
    params_1.sampler.wrapS = rnd.m_rnd.x;
    params_1.sampler.wrapT = rnd.m_rnd.y;
    params_1.sampler.wrapR = rnd.m_rnd.z;
    params_1.sampler.minFilter = rnd.m_rnd.w;
    params_1.sampler.borderColor.v._0_4_ = auStack_2e4._0_4_;
    params_1.sampler.compareChannel = (int)fStack_2e8;
    params_1.sampler.borderColor.v.uData[1] = auStack_2e4._4_4_;
    params_1.sampler.borderColor.v.uData[2] = auStack_2e4._8_4_;
    params_1.sampler.borderColor.v.uData[3] = auStack_2e4._12_4_;
    params_1.sampler.depthStencilMode = auStack_2e4._20_4_;
    params_1.sampler._52_4_ = auStack_2e4._16_4_ & 0xffffff00;
    params_1.lodMode = LODMODE_EXACT;
    iVar12 = (*this->m_renderCtx->_vptr_RenderContext[4])();
    lVar16 = CONCAT44(extraout_var_01,iVar12);
    local_338.colorMask.m_data[1] = 0 < *(int *)(lVar16 + 0xc);
    local_338.colorMask.m_data[0] = 0 < *(int *)(lVar16 + 8);
    local_338.colorMask.m_data[2] = 0 < *(int *)(lVar16 + 0x10);
    local_338.colorMask.m_data[3] = 0 < *(int *)(lVar16 + 0x14);
    iVar12 = (*this->m_renderCtx->_vptr_RenderContext[4])();
    pTVar1 = (TextureFormat *)(CONCAT44(extraout_var_02,iVar12) + 8);
    local_438._0_4_ = pTVar1->order;
    local_438._4_4_ = pTVar1->type;
    local_438._8_8_ = *(size_type *)(CONCAT44(extraout_var_02,iVar12) + 0x10);
    res.m_data[0] = 0;
    res.m_data[1] = 0;
    res.m_data[2] = 0;
    res.m_data[3] = 0;
    lVar16 = 0;
    do {
      res.m_data[lVar16] = *(int *)(local_438 + lVar16 * 4) + -2;
      lVar16 = lVar16 + 1;
    } while (lVar16 != 4);
    local_3f8._0_4_ = R;
    local_3f8._4_4_ = SNORM_INT8;
    local_3f8._8_8_ = 0;
    res_1.m_data[0] = 0;
    res_1.m_data[1] = 0;
    res_1.m_data[2] = 0;
    res_1.m_data[3] = 0;
    lVar16 = 0;
    do {
      iVar12 = *(int *)(local_3f8 + lVar16 * 4);
      if (*(int *)(local_3f8 + lVar16 * 4) < res.m_data[lVar16]) {
        iVar12 = res.m_data[lVar16];
      }
      res_1.m_data[lVar16] = iVar12;
      lVar16 = lVar16 + 1;
    } while (lVar16 != 4);
    tcu::computeFixedPointThreshold((tcu *)&rnd,&res_1);
    local_338.colorThreshold.m_data[0] = (float)rnd.m_rnd.x;
    local_338.colorThreshold.m_data[1] = (float)rnd.m_rnd.y;
    local_338.colorThreshold.m_data[2] = (float)rnd.m_rnd.z;
    local_338.colorThreshold.m_data[3] = (float)rnd.m_rnd.w;
    if (CVar3 == COORDTYPE_PROJECTED) {
      lVar16 = 0;
      do {
        (&rnd.m_rnd.x)[lVar16] = 8;
        lVar16 = lVar16 + 1;
      } while (lVar16 != 3);
      lodPrec.lodBits = 4;
    }
    else {
      lVar16 = 0;
      do {
        (&rnd.m_rnd.x)[lVar16] = 10;
        lVar16 = lVar16 + 1;
      } while (lVar16 != 3);
      lodPrec.lodBits = 6;
    }
    local_338.coordBits.m_data[2] = rnd.m_rnd.z;
    local_338.coordBits.m_data[0] = rnd.m_rnd.x;
    local_338.coordBits.m_data[1] = rnd.m_rnd.y;
    local_338.uvwBits.m_data[0] = 5;
    local_338.uvwBits.m_data[1] = 5;
    local_338.uvwBits.m_data[2] = 0;
    lodPrec.derivateBits = 10;
    if ((int)((ulong)((long)gridLayout.
                            super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)gridLayout.
                           super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 4) < 1) {
      local_4b0 = 0;
    }
    else {
      uVar20 = 0;
      lVar16 = 0xc;
      local_4b0 = 0;
      do {
        uVar18 = (uint)uVar20;
        iVar12 = *(int *)((long)(gridLayout.
                                 super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar16 + -0xc)
        ;
        iVar10 = *(int *)((long)(gridLayout.
                                 super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar16 + -8);
        iVar4 = *(int *)((long)(gridLayout.
                                super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar16 + -4);
        iVar5 = *(int *)((long)(gridLayout.
                                super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar16);
        glu::TextureTestUtil::computeQuadTexCoordCube
                  (&texCoord,uVar18 + (int)((uVar20 & 0xffffffff) / 6) * -6);
        if (CVar3 == COORDTYPE_PROJECTED) {
          params_1.super_RenderParams.flags._0_1_ = (byte)params_1.super_RenderParams.flags | 1;
          uVar15 = (ulong)((uVar18 & 3) << 4);
          params_1.super_RenderParams.w.m_data[0] =
               *(float *)((long)iterate::s_projections[0].m_data + uVar15);
          params_1.super_RenderParams.w.m_data[1] =
               *(float *)((long)iterate::s_projections[0].m_data + uVar15 + 4);
          params_1.super_RenderParams.w.m_data[2] =
               *(float *)((long)iterate::s_projections[0].m_data + uVar15 + 8);
          params_1.super_RenderParams.w.m_data[3] =
               *(float *)((long)iterate::s_projections[0].m_data + uVar15 + 0xc);
        }
        if (CVar3 == COORDTYPE_BASIC_BIAS) {
          params_1.super_RenderParams.flags._0_1_ = (byte)params_1.super_RenderParams.flags | 2;
          params_1.super_RenderParams.bias =
               Accuracy::Texture2DMipmapCase::iterate::s_bias[uVar18 & 7];
        }
        iVar13 = (*this->m_renderCtx->_vptr_RenderContext[4])();
        tcu::SurfaceAccess::SurfaceAccess
                  ((SurfaceAccess *)&res_1,&referenceFrame,
                   (PixelFormat *)(CONCAT44(extraout_var_03,iVar13) + 8),iVar12,iVar10,iVar4,iVar5);
        pTVar6 = this->m_texture;
        pCVar7 = (pTVar6->m_refTexture).m_view.m_levels[5];
        auStack_2e4._12_4_ = SUB84(pCVar7,0);
        auStack_2e4._16_4_ = (undefined4)((ulong)pCVar7 >> 0x20);
        rnd.m_rnd.x = (pTVar6->m_refTexture).m_view.m_numLevels;
        rnd.m_rnd.y = *(deUint32 *)&(pTVar6->m_refTexture).m_view.field_0x4;
        rnd.m_rnd._8_8_ = (pTVar6->m_refTexture).m_view.m_levels[0];
        aStack_2f8._M_allocated_capacity = (size_type)(pTVar6->m_refTexture).m_view.m_levels[1];
        pCVar7 = (pTVar6->m_refTexture).m_view.m_levels[2];
        pCVar9 = (pTVar6->m_refTexture).m_view.m_levels[3];
        auStack_2e4._4_8_ = (pTVar6->m_refTexture).m_view.m_levels[4];
        fStack_2e8 = SUB84(pCVar9,0);
        auStack_2e4._0_4_ = (undefined4)((ulong)pCVar9 >> 0x20);
        aStack_2f8._8_4_ = SUB84(pCVar7,0);
        aStack_2f8._12_4_ = (undefined4)((ulong)pCVar7 >> 0x20);
        glu::TextureTestUtil::sampleTexture
                  ((SurfaceAccess *)&res_1,(TextureCubeView *)&rnd,
                   texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start,&params_1);
        rnd.m_rnd.x = 8;
        rnd.m_rnd.y = 3;
        pvVar19 = (void *)renderedFrame.m_pixels.m_cap;
        if (renderedFrame.m_pixels.m_cap != 0) {
          pvVar19 = renderedFrame.m_pixels.m_ptr;
        }
        tcu::PixelBufferAccess::PixelBufferAccess
                  ((PixelBufferAccess *)&res,(TextureFormat *)&rnd,renderedFrame.m_width,
                   renderedFrame.m_height,1,pvVar19);
        tcu::getSubregion((PixelBufferAccess *)&res_1,(PixelBufferAccess *)&res,iVar12,iVar10,iVar4,
                          iVar5);
        rnd.m_rnd.x = 8;
        rnd.m_rnd.y = 3;
        pvVar19 = (void *)referenceFrame.m_pixels.m_cap;
        if (referenceFrame.m_pixels.m_cap != 0) {
          pvVar19 = referenceFrame.m_pixels.m_ptr;
        }
        tcu::PixelBufferAccess::PixelBufferAccess
                  ((PixelBufferAccess *)local_3f8,(TextureFormat *)&rnd,referenceFrame.m_width,
                   referenceFrame.m_height,1,pvVar19);
        tcu::getSubregion((PixelBufferAccess *)local_438,(PixelBufferAccess *)local_3f8,iVar12,
                          iVar10,iVar4,iVar5);
        rnd.m_rnd.x = 8;
        rnd.m_rnd.y = 3;
        pvVar19 = (void *)errorMask.m_pixels.m_cap;
        if (errorMask.m_pixels.m_cap != 0) {
          pvVar19 = errorMask.m_pixels.m_ptr;
        }
        tcu::PixelBufferAccess::PixelBufferAccess
                  (&local_58,(TextureFormat *)&rnd,errorMask.m_width,errorMask.m_height,1,pvVar19);
        tcu::getSubregion((PixelBufferAccess *)local_380,&local_58,iVar12,iVar10,iVar4,iVar5);
        pTVar6 = this->m_texture;
        pCVar7 = (pTVar6->m_refTexture).m_view.m_levels[5];
        auStack_2e4._12_4_ = SUB84(pCVar7,0);
        auStack_2e4._16_4_ = (undefined4)((ulong)pCVar7 >> 0x20);
        rnd.m_rnd.x = (pTVar6->m_refTexture).m_view.m_numLevels;
        rnd.m_rnd.y = *(deUint32 *)&(pTVar6->m_refTexture).m_view.field_0x4;
        rnd.m_rnd._8_8_ = (pTVar6->m_refTexture).m_view.m_levels[0];
        aStack_2f8._M_allocated_capacity = (size_type)(pTVar6->m_refTexture).m_view.m_levels[1];
        pCVar7 = (pTVar6->m_refTexture).m_view.m_levels[2];
        pCVar9 = (pTVar6->m_refTexture).m_view.m_levels[3];
        auStack_2e4._4_8_ = (pTVar6->m_refTexture).m_view.m_levels[4];
        fStack_2e8 = SUB84(pCVar9,0);
        auStack_2e4._0_4_ = (undefined4)((ulong)pCVar9 >> 0x20);
        aStack_2f8._8_4_ = SUB84(pCVar7,0);
        aStack_2f8._12_4_ = (undefined4)((ulong)pCVar7 >> 0x20);
        iVar12 = glu::TextureTestUtil::computeTextureLookupDiff
                           ((ConstPixelBufferAccess *)&res_1,(ConstPixelBufferAccess *)local_438,
                            (PixelBufferAccess *)local_380,(TextureCubeView *)&rnd,
                            texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start,&params_1,&local_338,&lodPrec,
                            ((this->super_TestCase).super_TestNode.m_testCtx)->m_watchDog);
        local_4b0 = local_4b0 + iVar12;
        uVar20 = uVar20 + 1;
        lVar16 = lVar16 + 0x10;
      } while ((long)uVar20 <
               (long)(int)((ulong)((long)gridLayout.
                                         super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)gridLayout.
                                        super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 4));
    }
    if (0 < local_4b0) {
      rnd.m_rnd._0_8_ = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
      this_00 = &rnd.m_rnd.z;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"ERROR: Image verification failed, found ",0x28);
      std::ostream::operator<<(this_00,local_4b0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," invalid pixels!",0x10)
      ;
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&rnd,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
      std::ios_base::~ios_base(local_290);
    }
    pTVar8 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    res.m_data._0_8_ = local_458;
    std::__cxx11::string::_M_construct<char_const*>((string *)&res,"Result","");
    local_438._0_8_ = (long)local_438 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"Verification result","");
    tcu::LogImageSet::LogImageSet((LogImageSet *)&res_1,(string *)&res,(string *)local_438);
    tcu::TestLog::startImageSet(pTVar8,(char *)res_1.m_data._0_8_,local_168._M_p);
    local_3f8._0_8_ = (long)local_3f8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3f8,"Rendered","");
    TVar2 = (TextureFormat)((long)local_380 + 0x10);
    local_380._0_8_ = TVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_380,"Rendered image","");
    pSVar17 = &renderedFrame;
    tcu::LogImage::LogImage
              ((LogImage *)&rnd,(string *)local_3f8,(string *)local_380,pSVar17,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)&rnd,(int)pTVar8,__buf,(size_t)pSVar17);
    if ((undefined1 *)CONCAT44(auStack_2e4._0_4_,fStack_2e8) != auStack_2e4 + 0xc) {
      operator_delete((undefined1 *)CONCAT44(auStack_2e4._0_4_,fStack_2e8),
                      CONCAT44(auStack_2e4._16_4_,auStack_2e4._12_4_) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)rnd.m_rnd._0_8_ != &aStack_2f8) {
      operator_delete((void *)rnd.m_rnd._0_8_,(ulong)(aStack_2f8._M_allocated_capacity + 1));
    }
    if ((TextureFormat)local_380._0_8_ != TVar2) {
      operator_delete((void *)local_380._0_8_,local_380._16_8_ + 1);
    }
    if (local_3f8._0_8_ != (long)local_3f8 + 0x10) {
      operator_delete((void *)local_3f8._0_8_,local_3f8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_p != local_158) {
      operator_delete(local_168._M_p,local_158[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)res_1.m_data._0_8_ != &local_178) {
      operator_delete((void *)res_1.m_data._0_8_,local_178._M_allocated_capacity + 1);
    }
    if (local_438._0_8_ != (long)local_438 + 0x10) {
      operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)res.m_data._0_8_ != local_458) {
      operator_delete((void *)res.m_data._0_8_,local_458[0]._M_allocated_capacity + 1);
    }
    if (0 < local_4b0) {
      pTVar8 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
      res.m_data._0_8_ = local_458;
      std::__cxx11::string::_M_construct<char_const*>((string *)&res,"Reference","");
      local_438._0_8_ = (long)local_438 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"Ideal reference","");
      pSVar17 = &referenceFrame;
      tcu::LogImage::LogImage
                ((LogImage *)&rnd,(string *)&res,(string *)local_438,pSVar17,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      iVar12 = (int)pTVar8;
      tcu::LogImage::write((LogImage *)&rnd,iVar12,__buf_00,(size_t)pSVar17);
      local_3f8._0_8_ = (long)local_3f8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3f8,"ErrorMask","");
      local_380._0_8_ = TVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_380,"Error mask","");
      pSVar17 = &errorMask;
      tcu::LogImage::LogImage
                ((LogImage *)&res_1,(string *)local_3f8,(string *)local_380,pSVar17,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)&res_1,iVar12,__buf_01,(size_t)pSVar17);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_p != local_158) {
        operator_delete(local_168._M_p,local_158[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)res_1.m_data._0_8_ != &local_178) {
        operator_delete((void *)res_1.m_data._0_8_,local_178._M_allocated_capacity + 1);
      }
      if ((TextureFormat)local_380._0_8_ != TVar2) {
        operator_delete((void *)local_380._0_8_,local_380._16_8_ + 1);
      }
      if (local_3f8._0_8_ != (long)local_3f8 + 0x10) {
        operator_delete((void *)local_3f8._0_8_,local_3f8._16_8_ + 1);
      }
      if ((undefined1 *)CONCAT44(auStack_2e4._0_4_,fStack_2e8) != auStack_2e4 + 0xc) {
        operator_delete((undefined1 *)CONCAT44(auStack_2e4._0_4_,fStack_2e8),
                        CONCAT44(auStack_2e4._16_4_,auStack_2e4._12_4_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)rnd.m_rnd._0_8_ != &aStack_2f8) {
        operator_delete((void *)rnd.m_rnd._0_8_,(ulong)(aStack_2f8._M_allocated_capacity + 1));
      }
      if (local_438._0_8_ != (long)local_438 + 0x10) {
        operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)res.m_data._0_8_ != local_458) {
        operator_delete((void *)res.m_data._0_8_,local_458[0]._M_allocated_capacity + 1);
      }
    }
    tcu::TestLog::endImageSet(((this->super_TestCase).super_TestNode.m_testCtx)->m_log);
    description = "Pass";
    if (local_4b0 != 0) {
      description = "Image verification failed";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestNode.m_testCtx,(uint)(local_4b0 != 0),description);
    tcu::Surface::~Surface(&errorMask);
    tcu::Surface::~Surface(&referenceFrame);
    if (gridLayout.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(gridLayout.
                      super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)gridLayout.
                            super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)gridLayout.
                            super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    tcu::Surface::~Surface(&renderedFrame);
    if (texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    return STOP;
  }
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_01,"Too small viewport","",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureMipmapTests.cpp"
             ,0x259);
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

TextureCubeMipmapCase::IterateResult TextureCubeMipmapCase::iterate (void)
{
	const deUint32			magFilter			= GL_NEAREST;
	const int				texWidth			= m_texture->getRefTexture().getSize();
	const int				texHeight			= m_texture->getRefTexture().getSize();
	const int				defViewportWidth	= texWidth*2;
	const int				defViewportHeight	= texHeight*2;

	const glw::Functions&	gl					= m_renderCtx.getFunctions();
	const RandomViewport	viewport			(m_renderCtx.getRenderTarget(), defViewportWidth, defViewportHeight, deStringHash(getName()));

	const bool				isProjected			= m_coordType == COORDTYPE_PROJECTED;
	const bool				useLodBias			= m_coordType == COORDTYPE_BASIC_BIAS;

	vector<float>			texCoord;
	tcu::Surface			renderedFrame		(viewport.width, viewport.height);

	// Bail out if rendertarget is too small.
	if (viewport.width < defViewportWidth/2 || viewport.height < defViewportHeight/2)
		throw tcu::NotSupportedError("Too small viewport", "", __FILE__, __LINE__);

	// Upload texture data.
	m_texture->upload();

	// Bind gradient texture and setup sampler parameters.
	gl.bindTexture	(GL_TEXTURE_CUBE_MAP, m_texture->getGLTexture());
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_S,		m_wrapS);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_T,		m_wrapT);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MIN_FILTER,	m_minFilter);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MAG_FILTER,	magFilter);

	GLU_EXPECT_NO_ERROR(gl.getError(), "After texture setup");

	// Compute grid.
	vector<IVec4> gridLayout;
	computeGridLayout(gridLayout, viewport.width, viewport.height);

	// Bias values.
	static const float s_bias[] = { 1.0f, -2.0f, 0.8f, -0.5f, 1.5f, 0.9f, 2.0f, 4.0f };

	// Projection values \note Less agressive than in 2D case due to smaller quads.
	static const Vec4 s_projections[] =
	{
		Vec4(1.2f, 1.0f, 0.7f, 1.0f),
		Vec4(1.3f, 0.8f, 0.6f, 1.1f),
		Vec4(0.8f, 1.0f, 1.2f, 0.8f),
		Vec4(1.2f, 1.0f, 1.3f, 0.9f)
	};

	// Render with GL
	for (int cellNdx = 0; cellNdx < (int)gridLayout.size(); cellNdx++)
	{
		const int			curX		= gridLayout[cellNdx].x();
		const int			curY		= gridLayout[cellNdx].y();
		const int			curW		= gridLayout[cellNdx].z();
		const int			curH		= gridLayout[cellNdx].w();
		const tcu::CubeFace	cubeFace	= (tcu::CubeFace)(cellNdx % tcu::CUBEFACE_LAST);
		RenderParams		params		(TEXTURETYPE_CUBE);

		DE_ASSERT(m_coordType != COORDTYPE_AFFINE); // Not supported.
		computeQuadTexCoordCube(texCoord, cubeFace);

		if (isProjected)
		{
			params.flags	|= ReferenceParams::PROJECTED;
			params.w		 = s_projections[cellNdx % DE_LENGTH_OF_ARRAY(s_projections)];
		}

		if (useLodBias)
		{
			params.flags	|= ReferenceParams::USE_BIAS;
			params.bias		 = s_bias[cellNdx % DE_LENGTH_OF_ARRAY(s_bias)];
		}

		// Render with GL.
		gl.viewport(viewport.x+curX, viewport.y+curY, curW, curH);
		m_renderer.renderQuad(0, &texCoord[0], params);
	}
	GLU_EXPECT_NO_ERROR(gl.getError(), "Draw");

	// Read result.
	glu::readPixels(m_renderCtx, viewport.x, viewport.y, renderedFrame.getAccess());
	GLU_EXPECT_NO_ERROR(gl.getError(), "Read pixels");

	// Render reference and compare
	{
		tcu::Surface			referenceFrame		(viewport.width, viewport.height);
		tcu::Surface			errorMask			(viewport.width, viewport.height);
		int						numFailedPixels		= 0;
		ReferenceParams			params				(TEXTURETYPE_CUBE);
		tcu::LookupPrecision	lookupPrec;
		tcu::LodPrecision		lodPrec				(tcu::LodPrecision::RULE_OPENGL);

		// Params for rendering reference
		params.sampler					= glu::mapGLSampler(m_wrapS, m_wrapT, m_minFilter, magFilter);
		params.sampler.seamlessCubeMap	= false;
		params.lodMode					= LODMODE_EXACT;

		// Comparison parameters
		lookupPrec.colorMask			= getCompareMask(m_renderCtx.getRenderTarget().getPixelFormat());
		lookupPrec.colorThreshold		= tcu::computeFixedPointThreshold(max(getBitsVec(m_renderCtx.getRenderTarget().getPixelFormat())-2, IVec4(0)));
		lookupPrec.coordBits			= isProjected ? tcu::IVec3(8) : tcu::IVec3(10);
		lookupPrec.uvwBits				= tcu::IVec3(5,5,0);
		lodPrec.derivateBits			= 10;
		lodPrec.lodBits					= isProjected ? 4 : 6;

		for (int cellNdx = 0; cellNdx < (int)gridLayout.size(); cellNdx++)
		{
			const int				curX		= gridLayout[cellNdx].x();
			const int				curY		= gridLayout[cellNdx].y();
			const int				curW		= gridLayout[cellNdx].z();
			const int				curH		= gridLayout[cellNdx].w();
			const tcu::CubeFace		cubeFace	= (tcu::CubeFace)(cellNdx % tcu::CUBEFACE_LAST);

			DE_ASSERT(m_coordType != COORDTYPE_AFFINE); // Not supported.
			computeQuadTexCoordCube(texCoord, cubeFace);

			if (isProjected)
			{
				params.flags	|= ReferenceParams::PROJECTED;
				params.w		 = s_projections[cellNdx % DE_LENGTH_OF_ARRAY(s_projections)];
			}

			if (useLodBias)
			{
				params.flags	|= ReferenceParams::USE_BIAS;
				params.bias		 = s_bias[cellNdx % DE_LENGTH_OF_ARRAY(s_bias)];
			}

			// Render ideal reference.
			{
				tcu::SurfaceAccess idealDst(referenceFrame, m_renderCtx.getRenderTarget().getPixelFormat(), curX, curY, curW, curH);
				sampleTexture(idealDst, m_texture->getRefTexture(), &texCoord[0], params);
			}

			// Compare this cell
			numFailedPixels += computeTextureLookupDiff(tcu::getSubregion(renderedFrame.getAccess(), curX, curY, curW, curH),
														tcu::getSubregion(referenceFrame.getAccess(), curX, curY, curW, curH),
														tcu::getSubregion(errorMask.getAccess(), curX, curY, curW, curH),
														m_texture->getRefTexture(), &texCoord[0], params,
														lookupPrec, lodPrec, m_testCtx.getWatchDog());
		}

		if (numFailedPixels > 0)
			m_testCtx.getLog() << TestLog::Message << "ERROR: Image verification failed, found " << numFailedPixels << " invalid pixels!" << TestLog::EndMessage;

		m_testCtx.getLog() << TestLog::ImageSet("Result", "Verification result")
						   << TestLog::Image("Rendered", "Rendered image", renderedFrame);

		if (numFailedPixels > 0)
		{
			m_testCtx.getLog() << TestLog::Image("Reference", "Ideal reference", referenceFrame)
							   << TestLog::Image("ErrorMask", "Error mask", errorMask);
		}

		m_testCtx.getLog() << TestLog::EndImageSet;

		{
			const bool isOk = numFailedPixels == 0;
			m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
									isOk ? "Pass"				: "Image verification failed");
		}
	}

	return STOP;
}